

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

vector * __thiscall lsh::vector::operator&(vector *__return_storage_ptr__,vector *this,vector *v)

{
  pointer puVar1;
  pointer puVar2;
  invalid_argument *this_00;
  ulong uVar3;
  ulong uVar4;
  allocator_type local_39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> c;
  
  if (this->size_ == v->size_) {
    uVar4 = (long)(this->components_).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->components_).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&c,uVar4 & 0xffffffff,&local_39);
    puVar1 = (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (v->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar3 = 0; (uVar4 & 0xffffffff) != uVar3; uVar3 = uVar3 + 1) {
      c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = puVar2[uVar3] & puVar1[uVar3];
    }
    vector(__return_storage_ptr__,&c,this->size_);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&c.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid vector size");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

unsigned int vector::size() const {
    return this->size_;
  }